

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

size_t __thiscall choc::value::Type::ComplexArray::getValueDataSize(ComplexArray *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  RepeatedGroup *g;
  RepeatedGroup *pRVar4;
  long lVar5;
  
  pRVar4 = (this->groups).items;
  sVar3 = 0;
  for (lVar5 = (ulong)(this->groups).size * 0x28; lVar5 != 0; lVar5 = lVar5 + -0x28) {
    uVar1 = pRVar4->repetitions;
    sVar2 = Type::getValueDataSize(&pRVar4->elementType);
    sVar3 = sVar3 + sVar2 * uVar1;
    pRVar4 = pRVar4 + 1;
  }
  return sVar3;
}

Assistant:

ObjectType* end() const                     { return items + size; }